

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  undefined8 uVar7;
  long lVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  RTCIntersectArguments *pRVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_14a1;
  long local_14a0;
  float local_1498;
  int local_1494;
  Ray *local_1490;
  ulong local_1488;
  RayQueryContext *local_1480;
  RTCIntersectArguments *local_1478;
  Geometry *local_1470;
  long local_1468;
  ulong local_1460;
  ulong *local_1458;
  ulong local_1450;
  long local_1448;
  Scene *local_1440;
  undefined4 local_1438;
  undefined4 local_1434;
  undefined4 local_1430;
  undefined4 local_142c;
  undefined4 local_1428;
  undefined4 local_1424;
  uint local_1420;
  uint local_141c;
  uint local_1418;
  RTCFilterFunctionNArguments local_1408;
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 local_13b8 [16];
  undefined1 *local_13a8;
  byte local_13a0;
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar55 = ray->tfar;
    if (0.0 <= fVar55) {
      local_1480 = context;
      local_1458 = local_11d8 + 1;
      aVar2 = (ray->dir).field_0;
      auVar41 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar20._8_4_ = 0x7fffffff;
      auVar20._0_8_ = 0x7fffffff7fffffff;
      auVar20._12_4_ = 0x7fffffff;
      auVar20 = vandps_avx512vl((undefined1  [16])aVar2,auVar20);
      auVar21._8_4_ = 0x219392ef;
      auVar21._0_8_ = 0x219392ef219392ef;
      auVar21._12_4_ = 0x219392ef;
      uVar15 = vcmpps_avx512vl(auVar20,auVar21,1);
      auVar20 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar63 = ZEXT1664(auVar20);
      auVar20 = vdivps_avx512vl(auVar20,(undefined1  [16])aVar2);
      auVar21 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar3 = (bool)((byte)uVar15 & 1);
      auVar37._0_4_ = (uint)bVar3 * auVar21._0_4_ | (uint)!bVar3 * auVar20._0_4_;
      bVar3 = (bool)((byte)(uVar15 >> 1) & 1);
      auVar37._4_4_ = (uint)bVar3 * auVar21._4_4_ | (uint)!bVar3 * auVar20._4_4_;
      bVar3 = (bool)((byte)(uVar15 >> 2) & 1);
      auVar37._8_4_ = (uint)bVar3 * auVar21._8_4_ | (uint)!bVar3 * auVar20._8_4_;
      bVar3 = (bool)((byte)(uVar15 >> 3) & 1);
      auVar37._12_4_ = (uint)bVar3 * auVar21._12_4_ | (uint)!bVar3 * auVar20._12_4_;
      auVar22._8_4_ = 0x3f7ffffa;
      auVar22._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar22._12_4_ = 0x3f7ffffa;
      auVar22 = vmulps_avx512vl(auVar37,auVar22);
      auVar23._8_4_ = 0x3f800003;
      auVar23._0_8_ = 0x3f8000033f800003;
      auVar23._12_4_ = 0x3f800003;
      auVar23 = vmulps_avx512vl(auVar37,auVar23);
      auVar42 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar64 = ZEXT3264(auVar42);
      auVar42 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar65 = ZEXT3264(auVar42);
      auVar42 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar66 = ZEXT3264(auVar42);
      auVar42 = vbroadcastss_avx512vl(auVar22);
      auVar67 = ZEXT3264(auVar42);
      auVar20 = vmovshdup_avx(auVar22);
      auVar42 = vbroadcastsd_avx512vl(auVar20);
      auVar68 = ZEXT3264(auVar42);
      auVar43._8_4_ = 2;
      auVar43._0_8_ = 0x200000002;
      auVar43._12_4_ = 2;
      auVar43._16_4_ = 2;
      auVar43._20_4_ = 2;
      auVar43._24_4_ = 2;
      auVar43._28_4_ = 2;
      auVar21 = vshufpd_avx(auVar22,auVar22,1);
      local_11f8 = vpermps_avx2(auVar43,ZEXT1632(auVar22));
      auVar54 = ZEXT3264(local_11f8);
      fVar45 = auVar23._0_4_;
      auVar42._8_4_ = 1;
      auVar42._0_8_ = 0x100000001;
      auVar42._12_4_ = 1;
      auVar42._16_4_ = 1;
      auVar42._20_4_ = 1;
      auVar42._24_4_ = 1;
      auVar42._28_4_ = 1;
      local_1238 = vpermps_avx2(auVar42,ZEXT1632(auVar23));
      auVar49 = ZEXT3264(local_1238);
      local_1258 = vpermps_avx2(auVar43,ZEXT1632(auVar23));
      auVar52 = ZEXT3264(local_1258);
      local_1460 = (ulong)(auVar22._0_4_ < 0.0) << 5;
      uVar17 = (ulong)(auVar20._0_4_ < 0.0) << 5 | 0x40;
      uVar15 = (ulong)(auVar21._0_4_ < 0.0) << 5 | 0x80;
      uVar18 = local_1460 ^ 0x20;
      local_1278._0_4_ = auVar41._0_4_;
      local_1278._4_4_ = local_1278._0_4_;
      local_1278._8_4_ = local_1278._0_4_;
      local_1278._12_4_ = local_1278._0_4_;
      local_1278._16_4_ = local_1278._0_4_;
      local_1278._20_4_ = local_1278._0_4_;
      local_1278._24_4_ = local_1278._0_4_;
      local_1278._28_4_ = local_1278._0_4_;
      auVar47 = ZEXT3264(local_1278);
      local_1298._4_4_ = fVar55;
      local_1298._0_4_ = fVar55;
      local_1298._8_4_ = fVar55;
      local_1298._12_4_ = fVar55;
      local_1298._16_4_ = fVar55;
      local_1298._20_4_ = fVar55;
      local_1298._24_4_ = fVar55;
      local_1298._28_4_ = fVar55;
      auVar50 = ZEXT3264(local_1298);
      local_1218 = fVar45;
      fStack_1214 = fVar45;
      fStack_1210 = fVar45;
      fStack_120c = fVar45;
      fStack_1208 = fVar45;
      fStack_1204 = fVar45;
      fStack_1200 = fVar45;
      fStack_11fc = fVar45;
      local_1490 = ray;
      fVar55 = fVar45;
      fVar56 = fVar45;
      fVar57 = fVar45;
      fVar58 = fVar45;
      fVar59 = fVar45;
      fVar60 = fVar45;
LAB_01c5ab90:
      if (local_1458 != local_11d8) {
        uVar19 = local_1458[-1];
        local_1458 = local_1458 + -1;
        while ((uVar19 & 8) == 0) {
          auVar42 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar19 + 0x40 + local_1460),
                                    auVar64._0_32_);
          auVar42 = vmulps_avx512vl(auVar67._0_32_,auVar42);
          auVar43 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar17),auVar65._0_32_);
          auVar43 = vmulps_avx512vl(auVar68._0_32_,auVar43);
          auVar42 = vmaxps_avx(auVar42,auVar43);
          auVar43 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar15),auVar66._0_32_);
          auVar44._4_4_ = auVar54._4_4_ * auVar43._4_4_;
          auVar44._0_4_ = auVar54._0_4_ * auVar43._0_4_;
          auVar44._8_4_ = auVar54._8_4_ * auVar43._8_4_;
          auVar44._12_4_ = auVar54._12_4_ * auVar43._12_4_;
          auVar44._16_4_ = auVar54._16_4_ * auVar43._16_4_;
          auVar44._20_4_ = auVar54._20_4_ * auVar43._20_4_;
          auVar44._24_4_ = auVar54._24_4_ * auVar43._24_4_;
          auVar44._28_4_ = auVar43._28_4_;
          auVar43 = vmaxps_avx(auVar44,auVar47._0_32_);
          auVar42 = vmaxps_avx(auVar42,auVar43);
          auVar43 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar18),auVar64._0_32_);
          auVar9._4_4_ = fVar55 * auVar43._4_4_;
          auVar9._0_4_ = fVar45 * auVar43._0_4_;
          auVar9._8_4_ = fVar56 * auVar43._8_4_;
          auVar9._12_4_ = fVar57 * auVar43._12_4_;
          auVar9._16_4_ = fVar58 * auVar43._16_4_;
          auVar9._20_4_ = fVar59 * auVar43._20_4_;
          auVar9._24_4_ = fVar60 * auVar43._24_4_;
          auVar9._28_4_ = auVar43._28_4_;
          auVar43 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar19 + 0x40 + (uVar17 ^ 0x20)),
                                    auVar65._0_32_);
          auVar10._4_4_ = auVar49._4_4_ * auVar43._4_4_;
          auVar10._0_4_ = auVar49._0_4_ * auVar43._0_4_;
          auVar10._8_4_ = auVar49._8_4_ * auVar43._8_4_;
          auVar10._12_4_ = auVar49._12_4_ * auVar43._12_4_;
          auVar10._16_4_ = auVar49._16_4_ * auVar43._16_4_;
          auVar10._20_4_ = auVar49._20_4_ * auVar43._20_4_;
          auVar10._24_4_ = auVar49._24_4_ * auVar43._24_4_;
          auVar10._28_4_ = auVar43._28_4_;
          auVar43 = vminps_avx(auVar9,auVar10);
          auVar44 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar19 + 0x40 + (uVar15 ^ 0x20)),
                                    auVar66._0_32_);
          auVar11._4_4_ = auVar52._4_4_ * auVar44._4_4_;
          auVar11._0_4_ = auVar52._0_4_ * auVar44._0_4_;
          auVar11._8_4_ = auVar52._8_4_ * auVar44._8_4_;
          auVar11._12_4_ = auVar52._12_4_ * auVar44._12_4_;
          auVar11._16_4_ = auVar52._16_4_ * auVar44._16_4_;
          auVar11._20_4_ = auVar52._20_4_ * auVar44._20_4_;
          auVar11._24_4_ = auVar52._24_4_ * auVar44._24_4_;
          auVar11._28_4_ = auVar44._28_4_;
          auVar44 = vminps_avx(auVar11,auVar50._0_32_);
          auVar43 = vminps_avx(auVar43,auVar44);
          uVar14 = vcmpps_avx512vl(auVar42,auVar43,2);
          if ((char)uVar14 == '\0') goto LAB_01c5ab90;
          uVar12 = uVar19 & 0xfffffffffffffff0;
          lVar8 = 0;
          for (uVar19 = uVar14; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
            lVar8 = lVar8 + 1;
          }
          uVar19 = *(ulong *)(uVar12 + lVar8 * 8);
          uVar13 = (uint)uVar14 - 1 & (uint)uVar14;
          uVar14 = (ulong)uVar13;
          if (uVar13 != 0) {
            do {
              *local_1458 = uVar19;
              local_1458 = local_1458 + 1;
              lVar8 = 0;
              for (uVar19 = uVar14; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                lVar8 = lVar8 + 1;
              }
              uVar14 = uVar14 - 1 & uVar14;
              uVar19 = *(ulong *)(uVar12 + lVar8 * 8);
            } while (uVar14 != 0);
          }
        }
        local_1468 = (ulong)((uint)uVar19 & 0xf) - 8;
        uVar19 = uVar19 & 0xfffffffffffffff0;
        for (local_1448 = 0; local_1448 != local_1468; local_1448 = local_1448 + 1) {
          local_14a0 = local_1448 * 0xb0;
          uVar1 = *(undefined4 *)&(local_1490->org).field_0;
          auVar26._4_4_ = uVar1;
          auVar26._0_4_ = uVar1;
          auVar26._8_4_ = uVar1;
          auVar26._12_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&(local_1490->org).field_0 + 4);
          auVar27._4_4_ = uVar1;
          auVar27._0_4_ = uVar1;
          auVar27._8_4_ = uVar1;
          auVar27._12_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&(local_1490->org).field_0 + 8);
          auVar28._4_4_ = uVar1;
          auVar28._0_4_ = uVar1;
          auVar28._8_4_ = uVar1;
          auVar28._12_4_ = uVar1;
          uVar1 = *(undefined4 *)&(local_1490->dir).field_0;
          auVar48._4_4_ = uVar1;
          auVar48._0_4_ = uVar1;
          auVar48._8_4_ = uVar1;
          auVar48._12_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&(local_1490->dir).field_0 + 4);
          auVar51._4_4_ = uVar1;
          auVar51._0_4_ = uVar1;
          auVar51._8_4_ = uVar1;
          auVar51._12_4_ = uVar1;
          fVar55 = (local_1490->dir).field_0.m128[2];
          auVar53._4_4_ = fVar55;
          auVar53._0_4_ = fVar55;
          auVar53._8_4_ = fVar55;
          auVar53._12_4_ = fVar55;
          auVar41 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + local_14a0),auVar26);
          auVar20 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x10 + local_14a0),auVar27);
          auVar21 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x20 + local_14a0),auVar28);
          auVar22 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x30 + local_14a0),auVar26);
          auVar23 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x40 + local_14a0),auVar27);
          auVar24 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar19 + 0x50 + local_14a0),auVar28);
          auVar25 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar19 + 0x60 + local_14a0),auVar26);
          auVar26 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar19 + 0x70 + local_14a0),auVar27);
          auVar27 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar19 + 0x80 + local_14a0),auVar28);
          auVar28 = vsubps_avx512vl(auVar25,auVar41);
          auVar29 = vsubps_avx512vl(auVar26,auVar20);
          auVar30 = vsubps_avx512vl(auVar27,auVar21);
          auVar31 = vsubps_avx512vl(auVar41,auVar22);
          auVar32 = vsubps_avx512vl(auVar20,auVar23);
          auVar33 = vsubps_avx512vl(auVar21,auVar24);
          auVar34 = vsubps_avx512vl(auVar22,auVar25);
          auVar35 = vsubps_avx512vl(auVar23,auVar26);
          auVar36 = vsubps_avx512vl(auVar24,auVar27);
          auVar37 = vaddps_avx512vl(auVar41,auVar25);
          auVar38 = vaddps_avx512vl(auVar20,auVar26);
          auVar39 = vaddps_avx512vl(auVar21,auVar27);
          auVar40 = vmulps_avx512vl(auVar38,auVar30);
          auVar40 = vfmsub231ps_avx512vl(auVar40,auVar29,auVar39);
          auVar39 = vmulps_avx512vl(auVar39,auVar28);
          auVar39 = vfmsub231ps_avx512vl(auVar39,auVar30,auVar37);
          auVar46._0_4_ = auVar29._0_4_ * auVar37._0_4_;
          auVar46._4_4_ = auVar29._4_4_ * auVar37._4_4_;
          auVar46._8_4_ = auVar29._8_4_ * auVar37._8_4_;
          auVar46._12_4_ = auVar29._12_4_ * auVar37._12_4_;
          auVar37 = vfmsub231ps_fma(auVar46,auVar28,auVar38);
          auVar38._0_4_ = fVar55 * auVar37._0_4_;
          auVar38._4_4_ = fVar55 * auVar37._4_4_;
          auVar38._8_4_ = fVar55 * auVar37._8_4_;
          auVar38._12_4_ = fVar55 * auVar37._12_4_;
          auVar37 = vfmadd231ps_avx512vl(auVar38,auVar51,auVar39);
          local_13d8 = vfmadd231ps_avx512vl(auVar37,auVar48,auVar40);
          auVar40._0_4_ = auVar22._0_4_ + auVar41._0_4_;
          auVar40._4_4_ = auVar22._4_4_ + auVar41._4_4_;
          auVar40._8_4_ = auVar22._8_4_ + auVar41._8_4_;
          auVar40._12_4_ = auVar22._12_4_ + auVar41._12_4_;
          auVar37 = vaddps_avx512vl(auVar20,auVar23);
          auVar38 = vaddps_avx512vl(auVar21,auVar24);
          auVar39 = vmulps_avx512vl(auVar37,auVar33);
          auVar39 = vfmsub231ps_avx512vl(auVar39,auVar32,auVar38);
          auVar38 = vmulps_avx512vl(auVar38,auVar31);
          auVar38 = vfmsub231ps_avx512vl(auVar38,auVar33,auVar40);
          auVar40 = vmulps_avx512vl(auVar40,auVar32);
          auVar37 = vfmsub231ps_avx512vl(auVar40,auVar31,auVar37);
          auVar61._0_4_ = fVar55 * auVar37._0_4_;
          auVar61._4_4_ = fVar55 * auVar37._4_4_;
          auVar61._8_4_ = fVar55 * auVar37._8_4_;
          auVar61._12_4_ = fVar55 * auVar37._12_4_;
          auVar37 = vfmadd231ps_avx512vl(auVar61,auVar51,auVar38);
          local_13c8 = vfmadd231ps_avx512vl(auVar37,auVar48,auVar39);
          auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar22 = vaddps_avx512vl(auVar22,auVar25);
          auVar23 = vaddps_avx512vl(auVar23,auVar26);
          auVar24 = vaddps_avx512vl(auVar24,auVar27);
          auVar25 = vmulps_avx512vl(auVar23,auVar36);
          auVar25 = vfmsub231ps_avx512vl(auVar25,auVar35,auVar24);
          auVar24 = vmulps_avx512vl(auVar24,auVar34);
          auVar24 = vfmsub231ps_avx512vl(auVar24,auVar36,auVar22);
          auVar39._0_4_ = auVar22._0_4_ * auVar35._0_4_;
          auVar39._4_4_ = auVar22._4_4_ * auVar35._4_4_;
          auVar39._8_4_ = auVar22._8_4_ * auVar35._8_4_;
          auVar39._12_4_ = auVar22._12_4_ * auVar35._12_4_;
          auVar22 = vfmsub231ps_fma(auVar39,auVar34,auVar23);
          auVar22 = vmulps_avx512vl(auVar53,auVar22);
          auVar22 = vfmadd231ps_avx512vl(auVar22,auVar51,auVar24);
          auVar22 = vfmadd231ps_avx512vl(auVar22,auVar48,auVar25);
          auVar62._0_4_ = local_13c8._0_4_ + local_13d8._0_4_;
          auVar62._4_4_ = local_13c8._4_4_ + local_13d8._4_4_;
          auVar62._8_4_ = local_13c8._8_4_ + local_13d8._8_4_;
          auVar62._12_4_ = local_13c8._12_4_ + local_13d8._12_4_;
          local_13b8 = vaddps_avx512vl(auVar22,auVar62);
          auVar23 = vandps_avx512vl(local_13b8,auVar37);
          auVar24._8_4_ = 0x34000000;
          auVar24._0_8_ = 0x3400000034000000;
          auVar24._12_4_ = 0x34000000;
          auVar24 = vmulps_avx512vl(auVar23,auVar24);
          auVar25 = vminps_avx512vl(local_13d8,local_13c8);
          auVar26 = vminps_avx512vl(auVar25,auVar22);
          auVar25._8_4_ = 0x80000000;
          auVar25._0_8_ = 0x8000000080000000;
          auVar25._12_4_ = 0x80000000;
          auVar25 = vxorps_avx512vl(auVar24,auVar25);
          uVar4 = vcmpps_avx512vl(auVar26,auVar25,5);
          auVar25 = vmaxps_avx512vl(local_13d8,local_13c8);
          auVar22 = vmaxps_avx512vl(auVar25,auVar22);
          uVar5 = vcmpps_avx512vl(auVar22,auVar24,2);
          local_13a0 = ((byte)uVar4 | (byte)uVar5) & 0xf;
          if (local_13a0 != 0) {
            auVar22 = vmulps_avx512vl(auVar32,auVar30);
            auVar24 = vmulps_avx512vl(auVar33,auVar28);
            auVar25 = vmulps_avx512vl(auVar31,auVar29);
            auVar26 = vmulps_avx512vl(auVar33,auVar35);
            auVar27 = vmulps_avx512vl(auVar31,auVar36);
            auVar38 = vmulps_avx512vl(auVar32,auVar34);
            auVar29 = vfmsub213ps_avx512vl(auVar29,auVar33,auVar22);
            auVar30 = vfmsub213ps_avx512vl(auVar30,auVar31,auVar24);
            auVar28 = vfmsub213ps_avx512vl(auVar28,auVar32,auVar25);
            auVar32 = vfmsub213ps_avx512vl(auVar36,auVar32,auVar26);
            auVar33 = vfmsub213ps_avx512vl(auVar34,auVar33,auVar27);
            auVar31 = vfmsub213ps_avx512vl(auVar35,auVar31,auVar38);
            auVar22 = vandps_avx512vl(auVar22,auVar37);
            auVar26 = vandps_avx512vl(auVar26,auVar37);
            uVar14 = vcmpps_avx512vl(auVar22,auVar26,1);
            auVar22 = vandps_avx512vl(auVar24,auVar37);
            auVar24 = vandps_avx512vl(auVar27,auVar37);
            uVar12 = vcmpps_avx512vl(auVar22,auVar24,1);
            auVar22 = vandps_avx512vl(auVar25,auVar37);
            auVar37 = vandps_avx512vl(auVar38,auVar37);
            uVar6 = vcmpps_avx512vl(auVar22,auVar37,1);
            bVar3 = (bool)((byte)uVar14 & 1);
            local_1368._0_4_ = (uint)bVar3 * auVar29._0_4_ | (uint)!bVar3 * auVar32._0_4_;
            bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
            local_1368._4_4_ = (uint)bVar3 * auVar29._4_4_ | (uint)!bVar3 * auVar32._4_4_;
            bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
            local_1368._8_4_ = (uint)bVar3 * auVar29._8_4_ | (uint)!bVar3 * auVar32._8_4_;
            bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
            local_1368._12_4_ = (uint)bVar3 * auVar29._12_4_ | (uint)!bVar3 * auVar32._12_4_;
            bVar3 = (bool)((byte)uVar12 & 1);
            local_1358._0_4_ = (uint)bVar3 * auVar30._0_4_ | (uint)!bVar3 * auVar33._0_4_;
            bVar3 = (bool)((byte)(uVar12 >> 1) & 1);
            local_1358._4_4_ = (uint)bVar3 * auVar30._4_4_ | (uint)!bVar3 * auVar33._4_4_;
            bVar3 = (bool)((byte)(uVar12 >> 2) & 1);
            local_1358._8_4_ = (uint)bVar3 * auVar30._8_4_ | (uint)!bVar3 * auVar33._8_4_;
            bVar3 = (bool)((byte)(uVar12 >> 3) & 1);
            local_1358._12_4_ = (uint)bVar3 * auVar30._12_4_ | (uint)!bVar3 * auVar33._12_4_;
            bVar3 = (bool)((byte)uVar6 & 1);
            local_1348._0_4_ = (float)((uint)bVar3 * auVar28._0_4_ | (uint)!bVar3 * auVar31._0_4_);
            bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
            local_1348._4_4_ = (float)((uint)bVar3 * auVar28._4_4_ | (uint)!bVar3 * auVar31._4_4_);
            bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
            local_1348._8_4_ = (float)((uint)bVar3 * auVar28._8_4_ | (uint)!bVar3 * auVar31._8_4_);
            bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
            local_1348._12_4_ =
                 (float)((uint)bVar3 * auVar28._12_4_ | (uint)!bVar3 * auVar31._12_4_);
            auVar33._0_4_ = fVar55 * local_1348._0_4_;
            auVar33._4_4_ = fVar55 * local_1348._4_4_;
            auVar33._8_4_ = fVar55 * local_1348._8_4_;
            auVar33._12_4_ = fVar55 * local_1348._12_4_;
            auVar22 = vfmadd213ps_fma(auVar51,local_1358,auVar33);
            auVar22 = vfmadd213ps_fma(auVar48,local_1368,auVar22);
            auVar32._0_4_ = auVar22._0_4_ + auVar22._0_4_;
            auVar32._4_4_ = auVar22._4_4_ + auVar22._4_4_;
            auVar32._8_4_ = auVar22._8_4_ + auVar22._8_4_;
            auVar32._12_4_ = auVar22._12_4_ + auVar22._12_4_;
            auVar31._0_4_ = auVar21._0_4_ * local_1348._0_4_;
            auVar31._4_4_ = auVar21._4_4_ * local_1348._4_4_;
            auVar31._8_4_ = auVar21._8_4_ * local_1348._8_4_;
            auVar31._12_4_ = auVar21._12_4_ * local_1348._12_4_;
            auVar20 = vfmadd213ps_fma(auVar20,local_1358,auVar31);
            auVar20 = vfmadd213ps_fma(auVar41,local_1368,auVar20);
            auVar41 = vrcp14ps_avx512vl(auVar32);
            auVar22 = auVar63._0_16_;
            auVar21 = vfnmadd213ps_avx512vl(auVar41,auVar32,auVar22);
            auVar41 = vfmadd132ps_fma(auVar21,auVar41,auVar41);
            local_1378._0_4_ = (auVar20._0_4_ + auVar20._0_4_) * auVar41._0_4_;
            local_1378._4_4_ = (auVar20._4_4_ + auVar20._4_4_) * auVar41._4_4_;
            local_1378._8_4_ = (auVar20._8_4_ + auVar20._8_4_) * auVar41._8_4_;
            local_1378._12_4_ = (auVar20._12_4_ + auVar20._12_4_) * auVar41._12_4_;
            uVar1 = *(undefined4 *)((long)&(local_1490->org).field_0 + 0xc);
            auVar41._4_4_ = uVar1;
            auVar41._0_4_ = uVar1;
            auVar41._8_4_ = uVar1;
            auVar41._12_4_ = uVar1;
            uVar4 = vcmpps_avx512vl(local_1378,auVar41,0xd);
            auVar29._8_4_ = 0x80000000;
            auVar29._0_8_ = 0x8000000080000000;
            auVar29._12_4_ = 0x80000000;
            auVar41 = vxorps_avx512vl(auVar32,auVar29);
            fVar55 = local_1490->tfar;
            auVar30._4_4_ = fVar55;
            auVar30._0_4_ = fVar55;
            auVar30._8_4_ = fVar55;
            auVar30._12_4_ = fVar55;
            uVar5 = vcmpps_avx512vl(local_1378,auVar30,2);
            uVar7 = vcmpps_avx512vl(auVar32,auVar41,4);
            local_13a0 = (byte)uVar4 & (byte)uVar5 & (byte)uVar7 & local_13a0;
            if (local_13a0 != 0) {
              local_14a0 = local_14a0 + uVar19;
              local_13a8 = &local_14a1;
              auVar34._8_4_ = 0x219392ef;
              auVar34._0_8_ = 0x219392ef219392ef;
              auVar34._12_4_ = 0x219392ef;
              uVar14 = vcmpps_avx512vl(auVar23,auVar34,5);
              auVar41 = vrcp14ps_avx512vl(local_13b8);
              auVar20 = vfnmadd213ps_avx512vl(local_13b8,auVar41,auVar22);
              auVar41 = vfmadd132ps_avx512vl(auVar20,auVar41,auVar41);
              fVar58 = (float)((uint)((byte)uVar14 & 1) * auVar41._0_4_);
              fVar57 = (float)((uint)((byte)(uVar14 >> 1) & 1) * auVar41._4_4_);
              fVar56 = (float)((uint)((byte)(uVar14 >> 2) & 1) * auVar41._8_4_);
              fVar55 = (float)((uint)((byte)(uVar14 >> 3) & 1) * auVar41._12_4_);
              auVar35._0_4_ = fVar58 * local_13d8._0_4_;
              auVar35._4_4_ = fVar57 * local_13d8._4_4_;
              auVar35._8_4_ = fVar56 * local_13d8._8_4_;
              auVar35._12_4_ = fVar55 * local_13d8._12_4_;
              local_1398 = vminps_avx512vl(auVar35,auVar22);
              auVar36._0_4_ = fVar58 * local_13c8._0_4_;
              auVar36._4_4_ = fVar57 * local_13c8._4_4_;
              auVar36._8_4_ = fVar56 * local_13c8._8_4_;
              auVar36._12_4_ = fVar55 * local_13c8._12_4_;
              local_1388 = vminps_avx512vl(auVar36,auVar22);
              local_1450 = (ulong)local_13a0;
              local_1440 = local_1480->scene;
              do {
                local_1488 = 0;
                for (uVar14 = local_1450; (uVar14 & 1) == 0;
                    uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                  local_1488 = local_1488 + 1;
                }
                local_1420 = *(uint *)(local_14a0 + 0x90 + local_1488 * 4);
                local_1470 = (local_1440->geometries).items[local_1420].ptr;
                if ((local_1470->mask & local_1490->mask) == 0) {
                  local_1450 = local_1450 ^ 1L << (local_1488 & 0x3f);
                }
                else {
                  pRVar16 = local_1480->args;
                  if ((pRVar16->filter == (RTCFilterFunctionN)0x0) &&
                     (local_1470->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01c5b361:
                    local_1490->tfar = -INFINITY;
                    return;
                  }
                  local_1338 = auVar68._0_32_;
                  local_1318 = auVar67._0_32_;
                  local_12f8 = auVar66._0_32_;
                  local_12d8 = auVar65._0_32_;
                  local_12b8 = auVar64._0_32_;
                  uVar14 = (ulong)(uint)((int)local_1488 * 4);
                  local_1408.context = local_1480->user;
                  local_1438 = *(undefined4 *)(local_1368 + uVar14);
                  local_1434 = *(undefined4 *)(local_1358 + uVar14);
                  local_1430 = *(undefined4 *)(local_1348 + uVar14);
                  local_142c = *(undefined4 *)(local_1398 + uVar14);
                  local_1428 = *(undefined4 *)(local_1388 + uVar14);
                  local_1424 = *(undefined4 *)(local_14a0 + 0xa0 + uVar14);
                  local_141c = (local_1408.context)->instID[0];
                  local_1418 = (local_1408.context)->instPrimID[0];
                  local_1498 = local_1490->tfar;
                  local_1490->tfar = *(float *)(local_1378 + uVar14);
                  local_1494 = -1;
                  local_1408.valid = &local_1494;
                  local_1408.geometryUserPtr = local_1470->userPtr;
                  local_1408.hit = (RTCHitN *)&local_1438;
                  local_1408.N = 1;
                  local_1408.ray = (RTCRayN *)local_1490;
                  if (((local_1470->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                      (local_1478 = pRVar16, (*local_1470->occlusionFilterN)(&local_1408),
                      pRVar16 = local_1478, *local_1408.valid != 0)) &&
                     ((pRVar16->filter == (RTCFilterFunctionN)0x0 ||
                      ((((pRVar16->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        (((local_1470->field_8).field_0x2 & 0x40) == 0)) ||
                       ((*pRVar16->filter)(&local_1408), *local_1408.valid != 0))))))
                  goto LAB_01c5b361;
                  local_1490->tfar = local_1498;
                  local_1450 = local_1450 ^ 1L << (local_1488 & 0x3f);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar63 = ZEXT1664(auVar41);
                  auVar64 = ZEXT3264(local_12b8);
                  auVar65 = ZEXT3264(local_12d8);
                  auVar66 = ZEXT3264(local_12f8);
                  auVar67 = ZEXT3264(local_1318);
                  auVar68 = ZEXT3264(local_1338);
                }
              } while (local_1450 != 0);
            }
          }
          auVar54 = ZEXT3264(local_11f8);
          auVar49 = ZEXT3264(local_1238);
          auVar52 = ZEXT3264(local_1258);
          auVar47 = ZEXT3264(local_1278);
          auVar50 = ZEXT3264(local_1298);
          fVar45 = local_1218;
          fVar55 = fStack_1214;
          fVar56 = fStack_1210;
          fVar57 = fStack_120c;
          fVar58 = fStack_1208;
          fVar59 = fStack_1204;
          fVar60 = fStack_1200;
        }
        goto LAB_01c5ab90;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }